

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void runpprop(runcxdef *ctx,uchar **codepp,objnum callobj,prpnum callprop,objnum obj,prpnum prop,
             int inh,int argc,objnum self)

{
  byte bVar1;
  errcxdef *peVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  uchar **codepp_00;
  objnum *p0;
  uint typ;
  runsdef *prVar6;
  objnum unaff_R15W;
  objnum target;
  objnum obj_local;
  byte local_191;
  uint local_190;
  uint local_18c;
  uchar **local_188;
  int local_17c;
  uint local_178;
  uint local_174;
  runsdef *local_170;
  errdef fr_;
  
  prVar6 = ctx->runcxsp;
  obj_local = obj;
  local_188 = codepp;
  if (obj == 0xffff) {
    ctx->runcxerr->errcxptr->erraac = 0;
    runsign(ctx,0x410);
  }
  local_18c = (uint)prop;
  uVar3 = objgetap(ctx->runcxmem,obj,prop,&target,inh);
  if (uVar3 != 0) {
    local_17c = argc;
    prVar6 = prVar6 + -(long)argc;
    local_191 = 1;
    local_174 = (uint)self;
    local_190 = (uint)callobj;
    local_178 = (uint)callprop;
    local_170 = prVar6;
    do {
      puVar5 = mcmlck(ctx->runcxmem,target);
      iVar4 = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      codepp_00 = local_188;
      fr_.errcode = iVar4;
      if (iVar4 != 0) {
        ctx->runcxerr->errcxptr = fr_.errprv;
        mcmunlck(ctx->runcxmem,target);
        if (iVar4 - 0x3fcU < 0xfffffff9) {
          dbgds(ctx->runcxdbg);
        }
        errrse1(ctx->runcxerr,&fr_);
      }
      fr_.errprv = ctx->runcxerr->errcxptr;
      ctx->runcxerr->errcxptr = &fr_;
      p0 = (objnum *)(puVar5 + (ulong)uVar3 + 6);
      bVar1 = puVar5[(ulong)uVar3 + 2];
      typ = (uint)bVar1;
      if (bVar1 < 0xe) {
        if (typ == 6) {
          if (local_188 != (uchar **)0x0) {
            uVar3 = runcpsav(ctx,local_188,(objnum)local_190,(prpnum)uVar3);
            prVar6 = (runsdef *)(ulong)uVar3;
          }
          runexe(ctx,(uchar *)p0,(objnum)local_174,target,(prpnum)local_18c,local_17c);
          if (codepp_00 != (uchar **)0x0) {
            puVar5 = mcmlck(ctx->runcxmem,(mcmon)local_190);
            *codepp_00 = puVar5 + ((ulong)prVar6 & 0xffffffff);
          }
        }
        else if (typ == 9) {
          outfmt(ctx->runcxtio,(uchar *)p0);
          codepp_00 = local_188;
        }
        else {
LAB_00136b4e:
          runpbuf(ctx,typ,p0);
          codepp_00 = local_188;
        }
      }
      else if (bVar1 != 0xe) {
        if (typ != 0x10) goto LAB_00136b4e;
        unaff_R15W = *p0;
      }
      mcmunlck(ctx->runcxmem,target);
      if (typ == 0x10) {
        runpprop(ctx,codepp_00,(objnum)local_190,(prpnum)local_178,unaff_R15W,(prpnum)local_18c,0,
                 local_17c,unaff_R15W);
      }
      peVar2 = ctx->runcxerr;
      peVar2->errcxptr = fr_.errprv;
      if (typ != 0xe) {
        if (ctx->runcxsp != local_170) {
          return;
        }
        break;
      }
      if ((local_191 & 1) == 0) {
        ctx->runcxerr->errcxptr->erraac = 0;
        runsign(ctx,0x40c);
      }
      if (codepp_00 != (uchar **)0x0) {
        uVar3 = runcpsav(ctx,codepp_00,(objnum)local_190,(prpnum)peVar2);
        prVar6 = (runsdef *)(ulong)uVar3;
      }
      (*ctx->runcxdmd)(ctx->runcxdmc,obj_local,(prpnum)local_18c);
      if (codepp_00 != (uchar **)0x0) {
        puVar5 = mcmlck(ctx->runcxmem,(mcmon)local_190);
        *codepp_00 = puVar5 + ((ulong)prVar6 & 0xffffffff);
      }
      uVar3 = objgetap(ctx->runcxmem,obj_local,(prpnum)local_18c,&target,inh);
      local_191 = 0;
    } while (uVar3 != 0);
  }
  ctx->runcxsp->runstyp = '\x05';
  ctx->runcxsp = ctx->runcxsp + 1;
  return;
}

Assistant:

void runpprop(runcxdef *ctx, uchar *noreg *codepp,
              objnum callobj, prpnum callprop,
              noreg objnum obj, prpnum prop, int inh, int argc, objnum self)
{
    uint     pofs;
    uint     saveofs;
    objdef  *objptr;
    prpdef  *prpptr;
    uchar   *val;
    int      typ;
    runsdef  sval;
    objnum   target;
    int      times_through = 0;
    int      err;
	objnum   otherobj;
	runsdef *sp_ret;

	NOREG((&obj, &codepp));

	/* 
	 *   Note the initial stack pointer before arguments.  This is the stack
	 *   slot where the caller expects the return value to be placed on
	 *   return. 
	 */
	sp_ret = ctx->runcxsp - argc;

    if (obj == MCMONINV) runsig(ctx, ERR_RUNNOBJ);
    
startover:
    pofs = objgetap(ctx->runcxmem, obj, prop, &target, inh);
    
    /* if nothing was found, push nil */
    if (!pofs)
    {
		runpush(ctx, DAT_NIL, &sval);
        return;
    }

    /* found a property; get the prpdef, and the value and type of data */
    objptr = mcmlck(ctx->runcxmem, target);
    ERRBEGIN(ctx->runcxerr)         /* catch errors so we can unlock object */

    prpptr = (prpdef *)(((uchar *)objptr) + pofs);
    val = prpvalp(prpptr);
    typ = prptype(prpptr);

    /* determine what to do based on property type */
    switch(typ)
    {
    case DAT_CODE:
        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);
        
        /* execute the code */
        runexe(ctx, val, self, target, prop, argc);
        
        /* restore caller's code pointer in case object moved */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);
        break;

    case DAT_REDIR:
        otherobj = osrp2(val);
        break;

    case DAT_DSTRING:
        outfmt(ctx->runcxtio, val);
        break;
        
    case DAT_DEMAND:
        break;
        
    default:
        runpbuf(ctx, typ, val);
        break;
    }

    /* we're done - unlock the object */
    mcmunlck(ctx->runcxmem, target);

    /* if it's redirected, redirect it now */
    if (typ == DAT_REDIR)
    {
        runpprop(ctx, codepp, callobj, callprop, otherobj, prop,
                 FALSE, argc, otherobj);
    }

    /* if an error occurs, unlock the object, and resignal the error */
    ERRCATCH(ctx->runcxerr, err)
        mcmunlck(ctx->runcxmem, target);
        if (err < ERR_RUNEXIT || err > ERR_RUNEXITOBJ)
            dbgdump(ctx->runcxdbg);                       /* dump the stack */
        errrse(ctx->runcxerr);
    ERREND(ctx->runcxerr)

    /* apply special handling for set-on-first-use data */
    if (typ == DAT_DEMAND)
    {
        /*
         *   if we've already done this, the property isn't being set by
         *   the callback, so we'll never get out of this loop - abort if
         *   so 
         */
        if (++times_through != 1)
            runsig(ctx, ERR_DMDLOOP);

        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);

        /* invoke the callback to set the property on demand */
        (*ctx->runcxdmd)(ctx->runcxdmc, obj, prop);

        /* restore caller's code pointer */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);

        /* try again now that it's been set up */
        goto startover;
	}

	/* 
	 *   If the property invocation didn't push a return value onto the
	 *   stack, push nil as the default result.  *All* property calls must
	 *   yield a value, since our caller might assume that they can pop a
	 *   result.  If the caller pops a result and we don't provide one, the
	 *   stack will be corrupted.  To ensure this doesn't happen, push a
	 *   default nil result if the stack pointer is where it was before the
	 *   caller pushed our arguments.
	 */
	if (ctx->runcxsp == sp_ret)
		runpush(ctx, DAT_NIL, &sval);
}